

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O2

ZyanU32 ZydisFormatterHelperGetExplicitSize
                  (ZydisFormatter *formatter,ZydisFormatterContext *context,
                  ZydisDecodedOperand *operand)

{
  byte bVar1;
  ZydisMemoryOperandType ZVar2;
  ZydisDecodedOperand *pZVar3;
  uint __line;
  ushort uVar4;
  char *__assertion;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assertion = "formatter";
    __line = 0x53;
LAB_00116e16:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,__line,
                  "ZyanU32 ZydisFormatterHelperGetExplicitSize(const ZydisFormatter *, ZydisFormatterContext *, const ZydisDecodedOperand *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assertion = "context";
    __line = 0x54;
    goto LAB_00116e16;
  }
  if (operand == (ZydisDecodedOperand *)0x0) {
    __assertion = "operand";
    __line = 0x55;
    goto LAB_00116e16;
  }
  if (operand->type != ZYDIS_OPERAND_TYPE_MEMORY) {
    __assertion = "operand->type == ZYDIS_OPERAND_TYPE_MEMORY";
    __line = 0x57;
    goto LAB_00116e16;
  }
  ZVar2 = (operand->field_10).mem.type;
  if ((ZYDIS_MEMOP_TYPE_MAX_VALUE < ZVar2) || ((0x16U >> (ZVar2 & 0x1f) & 1) == 0)) {
    __assertion = 
    "(operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) || (operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN) || (operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB)"
    ;
    __line = 0x5a;
    goto LAB_00116e16;
  }
  if (formatter->force_memory_size != '\0') {
    uVar4 = operand->size;
    goto LAB_00116d68;
  }
  if ((ZVar2 != ZYDIS_MEMOP_TYPE_AGEN) &&
     (pZVar3 = context->operands, pZVar3 != (ZydisDecodedOperand *)0x0)) {
    bVar1 = operand->id;
    if (bVar1 - 1 < 2) {
      uVar4 = pZVar3[bVar1].size;
      if (pZVar3[(ulong)bVar1 - 1].size != uVar4) goto LAB_00116d68;
    }
    else if ((bVar1 == 0) && (1 < context->instruction->operand_count_visible)) {
      if ((pZVar3[1].type & ~ZYDIS_OPERAND_TYPE_IMMEDIATE) == ZYDIS_OPERAND_TYPE_UNUSED) {
        uVar4 = pZVar3->size;
        goto LAB_00116d68;
      }
      uVar4 = pZVar3->size;
      if ((uVar4 != pZVar3[1].size) ||
         (((pZVar3[1].type == ZYDIS_OPERAND_TYPE_REGISTER &&
           (pZVar3[1].visibility == ZYDIS_OPERAND_VISIBILITY_IMPLICIT)) &&
          (pZVar3[1].field_10.mem.type == ZYDIS_MEMOP_TYPE_AGEN)))) goto LAB_00116d68;
    }
  }
  uVar4 = 0;
LAB_00116d68:
  return (ZyanU32)uVar4;
}

Assistant:

ZyanU32 ZydisFormatterHelperGetExplicitSize(const ZydisFormatter* formatter,
    ZydisFormatterContext* context, const ZydisDecodedOperand* operand)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(operand);

    ZYAN_ASSERT(operand->type == ZYDIS_OPERAND_TYPE_MEMORY);
    ZYAN_ASSERT((operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
                (operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN) ||
                (operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB));

    if (formatter->force_memory_size)
    {
        return operand->size;
    }
    else if (operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN)
    {
        return 0;
    }

    if (!context->operands)
    {
        // Single operand formatting. We can not derive the explicit size by using the other
        // operands.
        return 0;
    }

    switch (operand->id)
    {
    case 0:
        if (context->instruction->operand_count_visible < 2)
        {
            return 0;
        }
        if ((context->operands[1].type == ZYDIS_OPERAND_TYPE_UNUSED) ||
            (context->operands[1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE))
        {
            return context->operands[0].size;
        }
        if (context->operands[0].size != context->operands[1].size)
        {
            return context->operands[0].size;
        }
        if ((context->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (context->operands[1].visibility == ZYDIS_OPERAND_VISIBILITY_IMPLICIT) &&
            (context->operands[1].reg.value == ZYDIS_REGISTER_CL))
        {
            return context->operands[0].size;
        }
        break;
    case 1:
    case 2:
        if (context->operands[operand->id - 1].size !=
            context->operands[operand->id].size)
        {
            return context->operands[operand->id].size;
        }
        break;
    default:
        break;
    }

    return 0;
}